

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

string * __thiscall
pbrt::MLTSampler::PrimarySample::ToString_abi_cxx11_
          (string *__return_storage_ptr__,PrimarySample *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<long_const&,float_const&,long_const&>
            (__return_storage_ptr__,
             "[ PrimarySample lastModificationIteration: %d valueBackup: %f modifyBackup: %d ]",
             &this->lastModificationIteration,&this->valueBackup,&this->modifyBackup);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
            return StringPrintf("[ PrimarySample lastModificationIteration: %d "
                                "valueBackup: %f modifyBackup: %d ]",
                                lastModificationIteration, valueBackup, modifyBackup);
        }